

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O3

void __thiscall cmFileLockPool::PushFileScope(cmFileLockPool *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2->_M_prev = p_Var2;
  p_Var2->_M_next = p_Var2;
  p_Var2[1]._M_next = (_List_node_base *)0x0;
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = p_Var2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->FileScopes).
            super__List_base<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void cmFileLockPool::PushFileScope()
{
  this->FileScopes.push_back(new ScopePool());
}